

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varint.hpp
# Opt level: O2

uint pstore::varint::encoded_size(uint64_t x)

{
  uint uVar1;
  
  if (x >> 0x38 != 0) {
    return 9;
  }
  uVar1 = bit_count::clz(x | 1);
  return (0x3f - uVar1) / 7 + 1;
}

Assistant:

constexpr unsigned encoded_size (std::uint64_t const x) noexcept {
            // Each additional byte that we emit steals one bit from the first byte. We therefore
            // manage 7 bits per byte.
            constexpr auto nine_byte_threshold = (UINT64_C (1) << (7U * 8U)) - 1U;
            if (x > nine_byte_threshold) {
                return 9;
            }

            // The input to clz() is ORed with 1 to guarantee we don't pass 0 (which will
            // require 1 byte to store anyway).
            unsigned const bits = 64U - bit_count::clz (x | 1U);
            return (bits - 1U) / 7U + 1U;
        }